

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall xmrig::Network::onConfigChanged(Network *this)

{
  Config *in_RDX;
  Config *in_RSI;
  
  onConfigChanged((Network *)&this[-1].m_state.m_connectionTime,in_RSI,in_RDX);
  return;
}

Assistant:

void xmrig::Network::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->pools() == previousConfig->pools() || !config->pools().active()) {
        return;
    }

    m_strategy->stop();

    config->pools().print();

    delete m_strategy;
    m_strategy = config->pools().createStrategy(this);
    connect();
}